

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O0

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
set_graph_from_file(Cover_complex<std::vector<float,_std::allocator<float>_>_> *this,
                   string *graph_file_name)

{
  boost *this_00;
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  long *plVar4;
  reference pvVar5;
  subgraph<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>_>
  *in_R8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_408;
  stringstream local_3e8 [8];
  stringstream stream;
  int local_24c;
  string local_248 [4];
  int source;
  string line;
  ifstream input;
  int local_1c;
  string *psStack_18;
  int neighb;
  string *graph_file_name_local;
  Cover_complex<std::vector<float,_std::allocator<float>_>_> *this_local;
  
  psStack_18 = graph_file_name;
  graph_file_name_local = (string *)this;
  remove_edges(this,&this->one_skeleton);
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),(string *)psStack_18,_S_in);
  std::__cxx11::string::string(local_248);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),local_248);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_3e8,local_248,_Var2);
    std::istream::operator>>((istream *)local_3e8,&local_24c);
    while( true ) {
      plVar4 = (long *)std::istream::operator>>((istream *)local_3e8,&local_1c);
      bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if (!bVar1) break;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->vertices,(long)local_24c);
      this_00 = (boost *)*pvVar5;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->vertices,(long)local_1c);
      boost::
      add_edge<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_index_t,int,boost::property<boost::edge_weight_t,double,boost::no_property>>,boost::no_property,boost::listS>>
                (&local_408,this_00,*pvVar5,(vertex_descriptor)&this->one_skeleton,in_R8);
    }
    std::__cxx11::stringstream::~stringstream(local_3e8);
  }
  std::__cxx11::string::~string(local_248);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  return;
}

Assistant:

void set_graph_from_file(const std::string& graph_file_name) {
    remove_edges(one_skeleton);
    int neighb;
    std::ifstream input(graph_file_name);
    std::string line;
    int source;
    while (std::getline(input, line)) {
      std::stringstream stream(line);
      stream >> source;
      while (stream >> neighb) boost::add_edge(vertices[source], vertices[neighb], one_skeleton);
    }
  }